

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  bool bVar2;
  bool bVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  BreakpointSource BVar7;
  int32_t iVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  int iVar11;
  BreakpointSource BVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  uint end_00;
  int iVar19;
  long lVar21;
  int *piVar22;
  Breakpoint *pBVar23;
  uint *puVar24;
  Breakpoint *pBVar25;
  int iVar26;
  ulong uVar27;
  byte bVar28;
  type t;
  cpp_dec_float<200U,_int,_void> local_878;
  uint local_7f8 [30];
  uint local_780 [28];
  cpp_dec_float<200U,_int,_void> local_710;
  Breakpoint local_690;
  Breakpoint local_608;
  Breakpoint local_580;
  Breakpoint local_4f8;
  Breakpoint local_470;
  Breakpoint local_3e8;
  Breakpoint local_360;
  Breakpoint local_2d8;
  Breakpoint local_250;
  Breakpoint local_1c8;
  Breakpoint local_140;
  Breakpoint local_b8;
  ulong uVar20;
  
  bVar28 = 0;
  if (start + 1 < end) {
    end_00 = end - 1;
    uVar20 = (ulong)end_00;
    uVar13 = end_00 - start;
    if (0x18 < (int)uVar13) {
LAB_005d85a6:
      local_7f8[0x18] = 0;
      local_7f8[0x19] = 0;
      local_7f8[0x1a] = 0;
      local_7f8[0x1b] = 0;
      local_7f8[0x14] = 0;
      local_7f8[0x15] = 0;
      local_7f8[0x16] = 0;
      local_7f8[0x17] = 0;
      local_7f8[0x10] = 0;
      local_7f8[0x11] = 0;
      local_7f8[0x12] = 0;
      local_7f8[0x13] = 0;
      local_7f8[0xc] = 0;
      local_7f8[0xd] = 0;
      local_7f8[0xe] = 0;
      local_7f8[0xf] = 0;
      local_7f8[8] = 0;
      local_7f8[9] = 0;
      local_7f8[10] = 0;
      local_7f8[0xb] = 0;
      local_7f8[4] = 0;
      local_7f8[5] = 0;
      local_7f8[6] = 0;
      local_7f8[7] = 0;
      local_7f8[0] = 0;
      local_7f8[1] = 0;
      local_7f8[2] = 0;
      local_7f8[3] = 0;
      iVar14 = (uVar13 >> 1) + start;
      pBVar1 = keys + iVar14;
      pBVar23 = pBVar1;
      puVar24 = local_780;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
      }
      iVar26 = keys[iVar14].val.m_backend.exp;
      bVar2 = keys[iVar14].val.m_backend.neg;
      fVar4 = keys[iVar14].val.m_backend.fpclass;
      iVar5 = keys[iVar14].val.m_backend.prec_elem;
      uVar6._0_4_ = keys[iVar14].idx;
      uVar6._4_4_ = keys[iVar14].src;
      lVar17 = (long)start;
      iVar19 = (int)uVar20;
      uVar27 = uVar20;
      iVar14 = start;
      do {
        iVar16 = (int)uVar27;
        if ((type & 1U) == 0) {
          if (iVar14 < iVar19) {
            piVar22 = &keys[iVar14].idx;
            do {
              pBVar23 = (Breakpoint *)(piVar22 + -0x20);
              pBVar25 = &local_1c8;
              for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
              }
              local_1c8.val.m_backend.exp = piVar22[-4];
              local_1c8.val.m_backend.neg = *(bool *)(piVar22 + -3);
              local_1c8.val.m_backend._120_8_ = *(undefined8 *)(piVar22 + -2);
              local_1c8._128_8_ = *(undefined8 *)piVar22;
              puVar24 = local_780;
              pBVar23 = &local_4f8;
              for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
              }
              local_4f8.val.m_backend.exp = iVar26;
              local_4f8.val.m_backend.neg = bVar2;
              local_4f8.val.m_backend.fpclass = fVar4;
              local_4f8.val.m_backend.prec_elem = iVar5;
              local_4f8._128_8_ = uVar6;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_1c8,&local_4f8);
              if (local_878.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (0 < iVar15) break;
              iVar14 = iVar14 + 1;
              piVar22 = piVar22 + 0x22;
            } while (iVar19 != iVar14);
          }
          if (start < iVar16) {
            uVar27 = (ulong)iVar16;
            piVar22 = &keys[uVar27].idx;
            do {
              pBVar23 = (Breakpoint *)(piVar22 + -0x20);
              pBVar25 = &local_250;
              for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
              }
              local_250.val.m_backend.exp = piVar22[-4];
              local_250.val.m_backend.neg = *(bool *)(piVar22 + -3);
              local_250.val.m_backend._120_8_ = *(undefined8 *)(piVar22 + -2);
              local_250._128_8_ = *(undefined8 *)piVar22;
              puVar24 = local_780;
              pBVar23 = &local_580;
              for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
              }
              local_580.val.m_backend.exp = iVar26;
              local_580.val.m_backend.neg = bVar2;
              local_580.val.m_backend.fpclass = fVar4;
              local_580.val.m_backend.prec_elem = iVar5;
              local_580._128_8_ = uVar6;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_250,&local_580);
              if (local_878.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (iVar16 < 1) break;
              uVar27 = uVar27 - 1;
              piVar22 = piVar22 + -0x22;
            } while (lVar17 < (long)uVar27);
          }
        }
        else {
          if (iVar14 < iVar19) {
            piVar22 = &keys[iVar14].idx;
            lVar21 = 0;
            do {
              pBVar23 = (Breakpoint *)(piVar22 + -0x20);
              pBVar25 = &local_b8;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
              }
              local_b8.val.m_backend.exp = piVar22[-4];
              local_b8.val.m_backend.neg = *(bool *)(piVar22 + -3);
              local_b8.val.m_backend._120_8_ = *(undefined8 *)(piVar22 + -2);
              local_b8._128_8_ = *(undefined8 *)piVar22;
              puVar24 = local_780;
              pBVar23 = &local_3e8;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
              }
              local_3e8.val.m_backend.exp = iVar26;
              local_3e8.val.m_backend.neg = bVar2;
              local_3e8.val.m_backend.fpclass = fVar4;
              local_3e8.val.m_backend.prec_elem = iVar5;
              local_3e8._128_8_ = uVar6;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_b8,&local_3e8);
              if (local_878.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (-1 < iVar15) break;
              lVar21 = lVar21 + -1;
              piVar22 = piVar22 + 0x22;
            } while ((long)iVar14 - (long)iVar19 != lVar21);
            iVar14 = iVar14 - (int)lVar21;
          }
          if (start < iVar16) {
            uVar27 = (ulong)iVar16;
            piVar22 = &keys[uVar27].idx;
            do {
              pBVar23 = (Breakpoint *)(piVar22 + -0x20);
              pBVar25 = &local_140;
              for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
              }
              local_140.val.m_backend.exp = piVar22[-4];
              local_140.val.m_backend.neg = *(bool *)(piVar22 + -3);
              local_140.val.m_backend._120_8_ = *(undefined8 *)(piVar22 + -2);
              local_140._128_8_ = *(undefined8 *)piVar22;
              puVar24 = local_780;
              pBVar23 = &local_470;
              for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
              }
              local_470.val.m_backend.exp = iVar26;
              local_470.val.m_backend.neg = bVar2;
              local_470.val.m_backend.fpclass = fVar4;
              local_470.val.m_backend.prec_elem = iVar5;
              local_470._128_8_ = uVar6;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_140,&local_470);
              if (local_878.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (iVar16 < 0) break;
              uVar27 = uVar27 - 1;
              piVar22 = piVar22 + -0x22;
            } while (lVar17 < (long)uVar27);
          }
        }
        iVar16 = (int)uVar27;
        if (iVar16 <= iVar14) goto LAB_005d8b98;
        pBVar23 = keys + iVar14;
        puVar24 = local_7f8;
        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
          *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
          puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
        }
        iVar15 = keys[iVar14].val.m_backend.exp;
        bVar3 = keys[iVar14].val.m_backend.neg;
        iVar11 = keys[iVar14].idx;
        BVar12 = keys[iVar14].src;
        pBVar23 = keys + iVar16;
        pBVar25 = keys + iVar14;
        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
          (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
          pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
        }
        keys[iVar14].val.m_backend.exp = keys[iVar16].val.m_backend.exp;
        keys[iVar14].val.m_backend.neg = keys[iVar16].val.m_backend.neg;
        BVar7 = keys[iVar16].src;
        keys[iVar14].idx = keys[iVar16].idx;
        keys[iVar14].src = BVar7;
        puVar24 = local_7f8;
        pBVar23 = keys + iVar16;
        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
          (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        }
        keys[iVar16].val.m_backend.exp = iVar15;
        keys[iVar16].val.m_backend.neg = bVar3;
        fVar9 = keys[iVar14].val.m_backend.fpclass;
        iVar10 = keys[iVar14].val.m_backend.prec_elem;
        iVar8 = keys[iVar16].val.m_backend.prec_elem;
        keys[iVar14].val.m_backend.fpclass = keys[iVar16].val.m_backend.fpclass;
        keys[iVar14].val.m_backend.prec_elem = iVar8;
        keys[iVar16].val.m_backend.fpclass = fVar9;
        keys[iVar16].val.m_backend.prec_elem = iVar10;
        keys[iVar16].idx = iVar11;
        keys[iVar16].src = BVar12;
        iVar14 = iVar14 + 1;
        uVar27 = (ulong)(iVar16 - 1);
      } while( true );
    }
LAB_005d8fbd:
    if (0 < (int)uVar13) {
      SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                (keys,end_00,compare,start);
    }
  }
  return;
LAB_005d8b98:
  if ((type & 1U) == 0) {
    if (start < iVar16) {
      uVar27 = (ulong)iVar16;
      piVar22 = &keys[uVar27].idx;
      do {
        puVar24 = local_780;
        pBVar23 = &local_690;
        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
          (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        }
        pBVar23 = (Breakpoint *)(piVar22 + -0x20);
        pBVar25 = &local_360;
        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
          (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
          pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
        }
        local_360.val.m_backend.exp = piVar22[-4];
        local_360.val.m_backend.neg = *(bool *)(piVar22 + -3);
        local_360.val.m_backend._120_8_ = *(undefined8 *)(piVar22 + -2);
        local_360._128_8_ = *(undefined8 *)piVar22;
        local_690.val.m_backend.exp = iVar26;
        local_690.val.m_backend.neg = bVar2;
        local_690.val.m_backend.fpclass = fVar4;
        local_690.val.m_backend.prec_elem = iVar5;
        local_690._128_8_ = uVar6;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_878,compare,&local_690,&local_360);
        if (local_878.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_710,0,(type *)0x0);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_878,&local_710);
        if (0 < iVar16) break;
        uVar27 = uVar27 - 1;
        piVar22 = piVar22 + -0x22;
      } while (lVar17 < (long)uVar27);
    }
    iVar26 = (int)uVar27;
    if (iVar26 == iVar19) {
      pBVar23 = keys + iVar26;
      puVar24 = local_7f8;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
      }
      iVar16 = keys[iVar26].val.m_backend.exp;
      bVar2 = keys[iVar26].val.m_backend.neg;
      iVar15 = keys[iVar26].idx;
      BVar12 = keys[iVar26].src;
      pBVar23 = pBVar1;
      pBVar25 = keys + iVar26;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
      }
      keys[iVar26].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[iVar26].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar7 = pBVar1->src;
      keys[iVar26].idx = pBVar1->idx;
      keys[iVar26].src = BVar7;
      puVar24 = local_7f8;
      pBVar23 = pBVar1;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
        puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
      }
      (pBVar1->val).m_backend.exp = iVar16;
      (pBVar1->val).m_backend.neg = bVar2;
      fVar4 = keys[iVar26].val.m_backend.fpclass;
      iVar8 = keys[iVar26].val.m_backend.prec_elem;
      iVar5 = (pBVar1->val).m_backend.prec_elem;
      keys[iVar26].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[iVar26].val.m_backend.prec_elem = iVar5;
      (pBVar1->val).m_backend.fpclass = fVar4;
      (pBVar1->val).m_backend.prec_elem = iVar8;
      pBVar1->idx = iVar15;
      pBVar1->src = BVar12;
      uVar27 = (ulong)(iVar26 - 1);
    }
  }
  else {
    if (iVar14 < iVar19) {
      piVar22 = &keys[iVar14].idx;
      do {
        puVar24 = local_780;
        pBVar23 = &local_608;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        }
        pBVar23 = (Breakpoint *)(piVar22 + -0x20);
        pBVar25 = &local_2d8;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
          pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
        }
        local_2d8.val.m_backend.exp = piVar22[-4];
        local_2d8.val.m_backend.neg = *(bool *)(piVar22 + -3);
        local_2d8.val.m_backend._120_8_ = *(undefined8 *)(piVar22 + -2);
        local_2d8._128_8_ = *(undefined8 *)piVar22;
        local_608.val.m_backend.exp = iVar26;
        local_608.val.m_backend.neg = bVar2;
        local_608.val.m_backend.fpclass = fVar4;
        local_608.val.m_backend.prec_elem = iVar5;
        local_608._128_8_ = uVar6;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_878,compare,&local_608,&local_2d8);
        if (local_878.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_710,0,(type *)0x0);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_878,&local_710);
        if (iVar16 < 0) break;
        iVar14 = iVar14 + 1;
        piVar22 = piVar22 + 0x22;
      } while (iVar19 != iVar14);
    }
    if (iVar14 == start) {
      pBVar23 = keys + iVar14;
      puVar24 = local_7f8;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
      }
      iVar26 = keys[iVar14].val.m_backend.exp;
      bVar2 = keys[iVar14].val.m_backend.neg;
      iVar16 = keys[iVar14].idx;
      BVar12 = keys[iVar14].src;
      pBVar23 = pBVar1;
      pBVar25 = keys + iVar14;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
        pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar28 * -8 + 4);
      }
      keys[iVar14].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[iVar14].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar7 = pBVar1->src;
      keys[iVar14].idx = pBVar1->idx;
      keys[iVar14].src = BVar7;
      puVar24 = local_7f8;
      pBVar23 = pBVar1;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
        puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar28 * -8 + 4);
      }
      (pBVar1->val).m_backend.exp = iVar26;
      (pBVar1->val).m_backend.neg = bVar2;
      fVar4 = keys[iVar14].val.m_backend.fpclass;
      iVar8 = keys[iVar14].val.m_backend.prec_elem;
      iVar5 = (pBVar1->val).m_backend.prec_elem;
      keys[iVar14].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[iVar14].val.m_backend.prec_elem = iVar5;
      (pBVar1->val).m_backend.fpclass = fVar4;
      (pBVar1->val).m_backend.prec_elem = iVar8;
      pBVar1->idx = iVar16;
      pBVar1->src = BVar12;
      iVar14 = iVar14 + 1;
    }
  }
  iVar26 = (int)uVar27;
  if (iVar19 - iVar14 < iVar26 - start) {
    uVar20 = uVar27 & 0xffffffff;
    bVar2 = iVar19 <= iVar14;
    iVar26 = iVar19;
    iVar19 = iVar14;
    iVar14 = start;
    if (bVar2) goto LAB_005d8f9e;
  }
  else {
    bVar2 = iVar26 <= start;
    iVar19 = start;
    start = iVar14;
    if (bVar2) goto LAB_005d8f9e;
  }
  SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
            (keys,iVar26 + 1,compare,iVar19,(bool)(~type & 1));
  start = iVar14;
LAB_005d8f9e:
  type = (bool)(type ^ 1);
  end_00 = (uint)uVar20;
  uVar13 = end_00 - start;
  if ((int)uVar13 < 0x19) goto LAB_005d8fbd;
  goto LAB_005d85a6;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}